

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

bool __thiscall
LinearScan::ClearLoopExitIfRegUnused
          (LinearScan *this,Lifetime *lifetime,RegNum reg,BranchInstr *branchInstr,Loop *loop)

{
  uint uVar1;
  code *pcVar2;
  Lifetime ***this_00;
  bool bVar3;
  BOOLEAN BVar4;
  uint sourceContextId;
  uint functionId;
  uint32 uVar5;
  undefined4 *puVar6;
  Type_conflict node;
  Type *pppLVar7;
  Lifetime ***regContent;
  Iterator __iter;
  Loop *loop_local;
  BranchInstr *branchInstr_local;
  RegNum reg_local;
  Lifetime *lifetime_local;
  LinearScan *this_local;
  
  __iter.current = (NodeBase *)loop;
  sourceContextId = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar3 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_01eafdf0,ClearRegLoopExitPhase,sourceContextId,functionId);
  if (bVar3) {
    BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                      ((BVSparse<Memory::JitArenaAllocator> *)__iter.current[0x32].next,
                       (lifetime->sym->super_Sym).m_id);
    if ((BVar4 == '\0') && ((*(ushort *)&lifetime->field_0x9c >> 0xb & 1) == 0)) {
      uVar1 = lifetime->end;
      uVar5 = IR::Instr::GetNumber(&branchInstr->super_Instr);
      if (uVar5 < uVar1) {
        _regContent = SListBase<Lifetime_**,_Memory::ArenaAllocator,_RealCount>::GetIterator
                                ((SListBase<Lifetime_**,_Memory::ArenaAllocator,_RealCount> *)
                                 __iter.current[0x39].next);
        while( true ) {
          if (__iter.list == (SListBase<Lifetime_**,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          this_00 = regContent;
          node = SListNodeBase<Memory::ArenaAllocator>::Next
                           (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
          bVar3 = SListBase<Lifetime_**,_Memory::ArenaAllocator,_RealCount>::IsHead
                            ((SListBase<Lifetime_**,_Memory::ArenaAllocator,_RealCount> *)this_00,
                             node);
          if (bVar3) break;
          SListNodeBase<Memory::ArenaAllocator>::Next
                    (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
          pppLVar7 = SListBase<Lifetime_**,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                               ((Iterator *)&regContent);
          if ((*pppLVar7)[reg] == lifetime) {
            (*pppLVar7)[reg] = (Lifetime *)0x0;
          }
        }
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool LinearScan::ClearLoopExitIfRegUnused(Lifetime *lifetime, RegNum reg, IR::BranchInstr *branchInstr, Loop *loop)
{
    // If a lifetime was enregistered into the loop and then spilled, we need compensation at the bottom
    // of the loop to reload the lifetime into that register.
    // If that lifetime was spilled before it was ever used, we don't need the compensation code.
    // We do however need to clear the regContent on any loop exit as the register will not
    // be available anymore on that path.
    // Note: If the lifetime was reloaded into the same register, we might clear the regContent unnecessarily...
    if (!PHASE_OFF(Js::ClearRegLoopExitPhase, this->func))
    {
        return false;
    }
    if (!loop->regAlloc.symRegUseBv->Test(lifetime->sym->m_id) && !lifetime->needsStoreCompensation)
    {
        if (lifetime->end > branchInstr->GetNumber())
        {
            FOREACH_SLIST_ENTRY(Lifetime **, regContent, loop->regAlloc.exitRegContentList)
            {
                if (regContent[reg] == lifetime)
                {
                    regContent[reg] = nullptr;
                }
            } NEXT_SLIST_ENTRY;
        }
        return true;
    }

    return false;
}